

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O3

void __thiscall
chrono::utils::Generator::CreateObjectsBox
          (Generator *this,ChVector<double> *dist,ChVector<double> *pos,ChVector<double> *hdims,
          ChVector<double> *vel)

{
  int iVar1;
  PointVector local_c8;
  PointVector local_a8;
  Sampler<double> local_88;
  undefined1 local_48 [16];
  double local_38;
  
  normalizeMixture(this);
  iVar1 = (*(this->m_system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                    ();
  if (iVar1 == 1) {
    calcMinSeparation((ChVector<double> *)&local_88,this,dist);
    local_48._8_8_ = local_88.m_separation;
    local_48._0_8_ = local_88._vptr_Sampler;
    local_38 = local_88.m_center.m_data[0];
  }
  else {
    local_48 = *(undefined1 (*) [16])dist->m_data;
    local_38 = dist->m_data[2];
  }
  local_88.m_separation = (double)vmovlps_avx(local_48);
  local_88.m_center.m_data[0] = 0.0;
  local_88.m_center.m_data[1] = 0.0;
  local_88.m_center.m_data[2] = 0.0;
  local_88.m_size.m_data[0] = 0.0;
  local_88.m_size.m_data[1] = 0.0;
  local_88.m_size.m_data[2] = 0.0;
  local_88._vptr_Sampler = (_func_int **)&PTR__Sampler_00b4cad0;
  Sampler<double>::SampleBox(&local_a8,&local_88,pos,hdims);
  local_c8.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_a8.
       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_c8.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_a8.
       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_c8.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_a8.
       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  createObjects(this,&local_c8,vel);
  if (local_c8.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Generator::CreateObjectsBox(const ChVector<>& dist,
                                 const ChVector<>& pos,
                                 const ChVector<>& hdims,
                                 const ChVector<>& vel) {
    // Normalize the mixture ratios
    normalizeMixture();

    // When using SMC, make sure there is no shape overlap.
    ChVector<> distv;
    if (m_system->GetContactMethod() == ChContactMethod::SMC)
        distv = calcMinSeparation(dist);
    else
        distv = dist;

    // Generate the object locations
    GridSampler<> sampler(distv);
    PointVector points;
    points = sampler.SampleBox(pos, hdims);

    createObjects(points, vel);
}